

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  parasail_result_t *ppVar14;
  __m128i *palVar15;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  int iVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  __m128i *ptr_02;
  uint uVar23;
  char *__format;
  int16_t iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int32_t segNum;
  uint uVar32;
  long lVar33;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar48;
  undefined1 auVar49 [16];
  __m128i alVar50;
  short sVar51;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar52 [16];
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar66;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar76;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar34;
  short sVar39;
  short sVar42;
  short sVar47;
  short sVar75;
  short sVar77;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            uVar22 = uVar3 - 1;
            uVar29 = (ulong)uVar3 + 7 >> 3;
            uVar48 = (ulong)uVar22 % uVar29;
            uVar25 = -open;
            uVar23 = ppVar5->min;
            iVar18 = -uVar23;
            if (uVar23 != uVar25 && SBORROW4(uVar23,uVar25) == (int)(uVar23 + open) < 0) {
              iVar18 = open;
            }
            iVar28 = ppVar5->max;
            ppVar14 = parasail_result_new();
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x8200802;
              palVar15 = parasail_memalign___m128i(0x10,uVar29);
              ptr = parasail_memalign___m128i(0x10,uVar29);
              ptr_00 = parasail_memalign___m128i(0x10,uVar29);
              iVar16 = s2Len;
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              auVar36._0_4_ = -(uint)((int)((ulong)palVar15 >> 0x20) == 0 && (int)palVar15 == 0);
              auVar36._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar36._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar36._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar16 = movmskps(iVar16,auVar36);
              if (iVar16 == 0) {
                iVar16 = s2Len + -1;
                uVar17 = 7 - (int)(uVar22 / uVar29);
                auVar36 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar35 = auVar36._0_4_;
                auVar49._4_4_ = uVar35;
                auVar49._0_4_ = uVar35;
                auVar49._8_4_ = uVar35;
                auVar49._12_4_ = uVar35;
                auVar36 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar35 = auVar36._0_4_;
                uVar32 = iVar18 - 0x7fff;
                auVar36 = pshuflw(ZEXT416(uVar32),ZEXT416(uVar32),0);
                auVar37._0_4_ = auVar36._0_4_;
                auVar37._4_4_ = auVar37._0_4_;
                auVar37._8_4_ = auVar37._0_4_;
                auVar37._12_4_ = auVar37._0_4_;
                auVar40 = ZEXT416(CONCAT22((short)(uVar23 >> 0x10),0x7ffe - (short)iVar28));
                auVar41 = pshuflw(auVar40,auVar40,0);
                auVar40._0_4_ = auVar41._0_4_;
                auVar40._4_4_ = auVar40._0_4_;
                auVar40._8_4_ = auVar40._0_4_;
                auVar40._12_4_ = auVar40._0_4_;
                auVar44 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0);
                sVar34 = auVar44._0_2_;
                sVar39 = auVar44._2_2_;
                lVar31 = (long)(int)uVar25;
                for (uVar27 = 0; uVar27 != uVar29; uVar27 = uVar27 + 1) {
                  lVar26 = lVar31;
                  for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
                    lVar21 = lVar26;
                    if (s1_beg != 0) {
                      lVar21 = 0;
                    }
                    lVar30 = -0x8000;
                    if (-0x8000 < lVar21) {
                      lVar30 = lVar21;
                    }
                    lVar21 = lVar21 - (ulong)(uint)open;
                    if (lVar21 < -0x7fff) {
                      lVar21 = -0x8000;
                    }
                    *(short *)((long)&h + lVar33 * 2) = (short)lVar30;
                    *(short *)((long)&e + lVar33 * 2) = (short)lVar21;
                    lVar26 = lVar26 - uVar29 * (uint)gap;
                  }
                  palVar15[uVar27][0] = h.m[0];
                  palVar15[uVar27][1] = h.m[1];
                  ptr_00[uVar27][0] = e.m[0];
                  ptr_00[uVar27][1] = e.m[1];
                  lVar31 = lVar31 - (ulong)(uint)gap;
                }
                *ptr_01 = 0;
                uVar23 = uVar25;
                for (uVar27 = 1; s2Len + 1 != uVar27; uVar27 = uVar27 + 1) {
                  iVar24 = -0x8000;
                  if (-0x8000 < (int)uVar23) {
                    iVar24 = (int16_t)uVar23;
                  }
                  if (s2_beg != 0) {
                    iVar24 = 0;
                  }
                  ptr_01[uVar27] = iVar24;
                  uVar23 = uVar23 - gap;
                }
                uVar23 = (uint)uVar29;
                uVar27 = 0;
                auVar44 = auVar37;
                auVar52 = auVar37;
                iVar18 = iVar16;
                do {
                  ptr_02 = palVar15;
                  if (uVar27 == (uint)s2Len) {
                    if (s2_end != 0) {
                      iVar28 = 0;
                      while( true ) {
                        uVar29 = auVar52._0_8_;
                        lVar31 = auVar52._8_8_;
                        if ((int)uVar17 <= iVar28) break;
                        auVar52._0_8_ = uVar29 << 0x10;
                        auVar52._8_8_ = lVar31 << 0x10 | uVar29 >> 0x30;
                        iVar28 = iVar28 + 1;
                      }
                      uVar32 = (uint)auVar52._14_2_;
                    }
                    uVar66 = (ushort)uVar32;
                    uVar25 = uVar22;
                    if (s1_end != 0) {
                      uVar29 = 0;
                      while( true ) {
                        uVar66 = (ushort)uVar32;
                        if ((uVar23 & 0xfffffff) << 3 == (uint)uVar29) break;
                        uVar20 = ((uint)uVar29 & 7) * uVar23 + ((uint)(uVar29 >> 3) & 0x1fffffff);
                        if ((int)uVar20 < (int)uVar3) {
                          uVar69 = *(ushort *)((long)*ptr_02 + uVar29 * 2);
                          if ((short)uVar66 < (short)uVar69) {
                            uVar32 = (uint)uVar69;
                            iVar18 = iVar16;
                            uVar25 = uVar20;
                          }
                          else {
                            if ((int)uVar25 <= (int)uVar20) {
                              uVar20 = uVar25;
                            }
                            if (iVar18 != iVar16) {
                              uVar20 = uVar25;
                            }
                            if (uVar69 == uVar66) {
                              uVar25 = uVar20;
                            }
                          }
                        }
                        uVar29 = uVar29 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar50 = ptr_02[uVar48];
                      iVar18 = 0;
                      while( true ) {
                        uVar48 = alVar50[0];
                        lVar31 = alVar50[1];
                        if ((int)uVar17 <= iVar18) break;
                        alVar50[0] = uVar48 << 0x10;
                        alVar50[1] = lVar31 << 0x10 | uVar48 >> 0x30;
                        iVar18 = iVar18 + 1;
                      }
                      uVar66 = alVar50[1]._6_2_;
                      iVar18 = iVar16;
                      uVar25 = uVar22;
                    }
                    sVar34 = auVar36._0_2_;
                    auVar38._0_2_ = -(ushort)(auVar40._0_2_ < sVar34);
                    sVar39 = auVar36._2_2_;
                    auVar38._2_2_ = -(ushort)(auVar40._2_2_ < sVar39);
                    auVar38._4_2_ = -(ushort)(auVar40._4_2_ < sVar34);
                    auVar38._6_2_ = -(ushort)(auVar40._6_2_ < sVar39);
                    auVar38._8_2_ = -(ushort)(auVar40._8_2_ < sVar34);
                    auVar38._10_2_ = -(ushort)(auVar40._10_2_ < sVar39);
                    auVar38._12_2_ = -(ushort)(auVar40._12_2_ < sVar34);
                    auVar38._14_2_ = -(ushort)(auVar40._14_2_ < sVar39);
                    sVar34 = auVar41._0_2_;
                    auVar46._0_2_ = -(ushort)(sVar34 < auVar44._0_2_);
                    sVar39 = auVar41._2_2_;
                    auVar46._2_2_ = -(ushort)(sVar39 < auVar44._2_2_);
                    auVar46._4_2_ = -(ushort)(sVar34 < auVar44._4_2_);
                    auVar46._6_2_ = -(ushort)(sVar39 < auVar44._6_2_);
                    auVar46._8_2_ = -(ushort)(sVar34 < auVar44._8_2_);
                    auVar46._10_2_ = -(ushort)(sVar39 < auVar44._10_2_);
                    auVar46._12_2_ = -(ushort)(sVar34 < auVar44._12_2_);
                    auVar46._14_2_ = -(ushort)(sVar39 < auVar44._14_2_);
                    auVar46 = auVar46 | auVar38;
                    if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar46 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar46 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar46 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar46 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar46 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar46[0xf] < '\0') {
                      *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                      uVar66 = 0;
                      iVar18 = 0;
                      uVar25 = 0;
                    }
                    ppVar14->score = (int)(short)uVar66;
                    ppVar14->end_query = uVar25;
                    ppVar14->end_ref = iVar18;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar14;
                  }
                  uVar59 = ptr_02[uVar23 - 1][0];
                  iVar28 = ppVar5->mapper[(byte)s2[uVar27]];
                  auVar63._8_8_ = ptr_02[uVar23 - 1][1] << 0x10 | uVar59 >> 0x30;
                  auVar63._0_8_ = uVar59 << 0x10 | (ulong)(ushort)ptr_01[uVar27];
                  auVar60 = auVar37;
                  for (lVar31 = 0; uVar29 * 0x10 != lVar31; lVar31 = lVar31 + 0x10) {
                    auVar61 = paddsw(auVar63,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar31 + (long)(int)(iVar28 * uVar23) * 0x10));
                    auVar63 = *(undefined1 (*) [16])((long)*ptr_00 + lVar31);
                    sVar43 = auVar60._0_2_;
                    sVar53 = auVar63._0_2_;
                    uVar66 = (ushort)(sVar53 < sVar43) * sVar43 |
                             (ushort)(sVar53 >= sVar43) * sVar53;
                    sVar6 = auVar60._2_2_;
                    sVar54 = auVar63._2_2_;
                    uVar69 = (ushort)(sVar54 < sVar6) * sVar6 | (ushort)(sVar54 >= sVar6) * sVar54;
                    sVar7 = auVar60._4_2_;
                    sVar55 = auVar63._4_2_;
                    uVar70 = (ushort)(sVar55 < sVar7) * sVar7 | (ushort)(sVar55 >= sVar7) * sVar55;
                    sVar8 = auVar60._6_2_;
                    sVar56 = auVar63._6_2_;
                    uVar71 = (ushort)(sVar56 < sVar8) * sVar8 | (ushort)(sVar56 >= sVar8) * sVar56;
                    sVar9 = auVar60._8_2_;
                    sVar57 = auVar63._8_2_;
                    uVar72 = (ushort)(sVar57 < sVar9) * sVar9 | (ushort)(sVar57 >= sVar9) * sVar57;
                    sVar10 = auVar60._10_2_;
                    sVar58 = auVar63._10_2_;
                    uVar73 = (ushort)(sVar58 < sVar10) * sVar10 |
                             (ushort)(sVar58 >= sVar10) * sVar58;
                    sVar11 = auVar60._12_2_;
                    sVar75 = auVar63._12_2_;
                    sVar77 = auVar63._14_2_;
                    uVar74 = (ushort)(sVar75 < sVar11) * sVar11 |
                             (ushort)(sVar75 >= sVar11) * sVar75;
                    sVar51 = auVar60._14_2_;
                    uVar76 = (ushort)(sVar77 < sVar51) * sVar51 |
                             (ushort)(sVar77 >= sVar51) * sVar77;
                    sVar42 = auVar61._0_2_;
                    auVar67._0_2_ =
                         (ushort)((short)uVar66 < sVar42) * sVar42 |
                         ((short)uVar66 >= sVar42) * uVar66;
                    sVar42 = auVar61._2_2_;
                    auVar67._2_2_ =
                         (ushort)((short)uVar69 < sVar42) * sVar42 |
                         ((short)uVar69 >= sVar42) * uVar69;
                    sVar42 = auVar61._4_2_;
                    auVar67._4_2_ =
                         (ushort)((short)uVar70 < sVar42) * sVar42 |
                         ((short)uVar70 >= sVar42) * uVar70;
                    sVar42 = auVar61._6_2_;
                    auVar67._6_2_ =
                         (ushort)((short)uVar71 < sVar42) * sVar42 |
                         ((short)uVar71 >= sVar42) * uVar71;
                    sVar42 = auVar61._8_2_;
                    auVar67._8_2_ =
                         (ushort)((short)uVar72 < sVar42) * sVar42 |
                         ((short)uVar72 >= sVar42) * uVar72;
                    sVar42 = auVar61._10_2_;
                    auVar67._10_2_ =
                         (ushort)((short)uVar73 < sVar42) * sVar42 |
                         ((short)uVar73 >= sVar42) * uVar73;
                    sVar42 = auVar61._12_2_;
                    auVar67._12_2_ =
                         (ushort)((short)uVar74 < sVar42) * sVar42 |
                         ((short)uVar74 >= sVar42) * uVar74;
                    sVar42 = auVar61._14_2_;
                    auVar67._14_2_ =
                         (ushort)((short)uVar76 < sVar42) * sVar42 |
                         ((short)uVar76 >= sVar42) * uVar76;
                    *(undefined1 (*) [16])((long)*ptr + lVar31) = auVar67;
                    sVar42 = auVar44._0_2_;
                    auVar45._0_2_ =
                         (sVar42 < (short)auVar67._0_2_) * auVar67._0_2_ |
                         (ushort)(sVar42 >= (short)auVar67._0_2_) * sVar42;
                    sVar42 = auVar44._2_2_;
                    auVar45._2_2_ =
                         (sVar42 < (short)auVar67._2_2_) * auVar67._2_2_ |
                         (ushort)(sVar42 >= (short)auVar67._2_2_) * sVar42;
                    sVar42 = auVar44._4_2_;
                    auVar45._4_2_ =
                         (sVar42 < (short)auVar67._4_2_) * auVar67._4_2_ |
                         (ushort)(sVar42 >= (short)auVar67._4_2_) * sVar42;
                    sVar42 = auVar44._6_2_;
                    auVar45._6_2_ =
                         (sVar42 < (short)auVar67._6_2_) * auVar67._6_2_ |
                         (ushort)(sVar42 >= (short)auVar67._6_2_) * sVar42;
                    sVar42 = auVar44._8_2_;
                    auVar45._8_2_ =
                         (sVar42 < (short)auVar67._8_2_) * auVar67._8_2_ |
                         (ushort)(sVar42 >= (short)auVar67._8_2_) * sVar42;
                    sVar42 = auVar44._10_2_;
                    auVar45._10_2_ =
                         (sVar42 < (short)auVar67._10_2_) * auVar67._10_2_ |
                         (ushort)(sVar42 >= (short)auVar67._10_2_) * sVar42;
                    sVar42 = auVar44._12_2_;
                    sVar47 = auVar44._14_2_;
                    auVar45._12_2_ =
                         (sVar42 < (short)auVar67._12_2_) * auVar67._12_2_ |
                         (ushort)(sVar42 >= (short)auVar67._12_2_) * sVar42;
                    auVar45._14_2_ =
                         (sVar47 < (short)auVar67._14_2_) * auVar67._14_2_ |
                         (ushort)(sVar47 >= (short)auVar67._14_2_) * sVar47;
                    sVar42 = auVar40._0_2_;
                    uVar66 = (ushort)(sVar53 < sVar42) * sVar53 |
                             (ushort)(sVar53 >= sVar42) * sVar42;
                    sVar42 = auVar40._2_2_;
                    uVar69 = (ushort)(sVar54 < sVar42) * sVar54 |
                             (ushort)(sVar54 >= sVar42) * sVar42;
                    sVar42 = auVar40._4_2_;
                    uVar70 = (ushort)(sVar55 < sVar42) * sVar55 |
                             (ushort)(sVar55 >= sVar42) * sVar42;
                    sVar42 = auVar40._6_2_;
                    uVar71 = (ushort)(sVar56 < sVar42) * sVar56 |
                             (ushort)(sVar56 >= sVar42) * sVar42;
                    sVar42 = auVar40._8_2_;
                    uVar72 = (ushort)(sVar57 < sVar42) * sVar57 |
                             (ushort)(sVar57 >= sVar42) * sVar42;
                    sVar42 = auVar40._10_2_;
                    uVar73 = (ushort)(sVar58 < sVar42) * sVar58 |
                             (ushort)(sVar58 >= sVar42) * sVar42;
                    sVar42 = auVar40._12_2_;
                    sVar47 = auVar40._14_2_;
                    uVar74 = (ushort)(sVar75 < sVar42) * sVar75 |
                             (ushort)(sVar75 >= sVar42) * sVar42;
                    uVar76 = (ushort)(sVar77 < sVar47) * sVar77 |
                             (ushort)(sVar77 >= sVar47) * sVar47;
                    uVar66 = (ushort)(sVar43 < (short)uVar66) * sVar43 |
                             (sVar43 >= (short)uVar66) * uVar66;
                    uVar69 = (ushort)(sVar6 < (short)uVar69) * sVar6 |
                             (sVar6 >= (short)uVar69) * uVar69;
                    uVar70 = (ushort)(sVar7 < (short)uVar70) * sVar7 |
                             (sVar7 >= (short)uVar70) * uVar70;
                    uVar71 = (ushort)(sVar8 < (short)uVar71) * sVar8 |
                             (sVar8 >= (short)uVar71) * uVar71;
                    uVar72 = (ushort)(sVar9 < (short)uVar72) * sVar9 |
                             (sVar9 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar10 < (short)uVar73) * sVar10 |
                             (sVar10 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar11 < (short)uVar74) * sVar11 |
                             (sVar11 >= (short)uVar74) * uVar74;
                    uVar76 = (ushort)(sVar51 < (short)uVar76) * sVar51 |
                             (sVar51 >= (short)uVar76) * uVar76;
                    auVar40._0_2_ =
                         ((short)auVar67._0_2_ < (short)uVar66) * auVar67._0_2_ |
                         ((short)auVar67._0_2_ >= (short)uVar66) * uVar66;
                    auVar40._2_2_ =
                         ((short)auVar67._2_2_ < (short)uVar69) * auVar67._2_2_ |
                         ((short)auVar67._2_2_ >= (short)uVar69) * uVar69;
                    auVar40._4_2_ =
                         ((short)auVar67._4_2_ < (short)uVar70) * auVar67._4_2_ |
                         ((short)auVar67._4_2_ >= (short)uVar70) * uVar70;
                    auVar40._6_2_ =
                         ((short)auVar67._6_2_ < (short)uVar71) * auVar67._6_2_ |
                         ((short)auVar67._6_2_ >= (short)uVar71) * uVar71;
                    auVar40._8_2_ =
                         ((short)auVar67._8_2_ < (short)uVar72) * auVar67._8_2_ |
                         ((short)auVar67._8_2_ >= (short)uVar72) * uVar72;
                    auVar40._10_2_ =
                         ((short)auVar67._10_2_ < (short)uVar73) * auVar67._10_2_ |
                         ((short)auVar67._10_2_ >= (short)uVar73) * uVar73;
                    auVar40._12_2_ =
                         ((short)auVar67._12_2_ < (short)uVar74) * auVar67._12_2_ |
                         ((short)auVar67._12_2_ >= (short)uVar74) * uVar74;
                    auVar40._14_2_ =
                         ((short)auVar67._14_2_ < (short)uVar76) * auVar67._14_2_ |
                         ((short)auVar67._14_2_ >= (short)uVar76) * uVar76;
                    auVar68 = psubsw(auVar67,auVar49);
                    auVar61._4_4_ = uVar35;
                    auVar61._0_4_ = uVar35;
                    auVar61._8_4_ = uVar35;
                    auVar61._12_4_ = uVar35;
                    auVar44 = psubsw(auVar63,auVar61);
                    sVar43 = auVar68._0_2_;
                    sVar51 = auVar44._0_2_;
                    sVar42 = auVar68._2_2_;
                    sVar47 = auVar44._2_2_;
                    sVar6 = auVar68._4_2_;
                    sVar53 = auVar44._4_2_;
                    sVar7 = auVar68._6_2_;
                    sVar54 = auVar44._6_2_;
                    sVar8 = auVar68._8_2_;
                    sVar55 = auVar44._8_2_;
                    sVar9 = auVar68._10_2_;
                    sVar56 = auVar44._10_2_;
                    sVar10 = auVar68._12_2_;
                    sVar57 = auVar44._12_2_;
                    sVar58 = auVar44._14_2_;
                    sVar11 = auVar68._14_2_;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar31);
                    *puVar1 = (ushort)(sVar51 < sVar43) * sVar43 |
                              (ushort)(sVar51 >= sVar43) * sVar51;
                    puVar1[1] = (ushort)(sVar47 < sVar42) * sVar42 |
                                (ushort)(sVar47 >= sVar42) * sVar47;
                    puVar1[2] = (ushort)(sVar53 < sVar6) * sVar6 |
                                (ushort)(sVar53 >= sVar6) * sVar53;
                    puVar1[3] = (ushort)(sVar54 < sVar7) * sVar7 |
                                (ushort)(sVar54 >= sVar7) * sVar54;
                    puVar1[4] = (ushort)(sVar55 < sVar8) * sVar8 |
                                (ushort)(sVar55 >= sVar8) * sVar55;
                    puVar1[5] = (ushort)(sVar56 < sVar9) * sVar9 |
                                (ushort)(sVar56 >= sVar9) * sVar56;
                    puVar1[6] = (ushort)(sVar57 < sVar10) * sVar10 |
                                (ushort)(sVar57 >= sVar10) * sVar57;
                    puVar1[7] = (ushort)(sVar58 < sVar11) * sVar11 |
                                (ushort)(sVar58 >= sVar11) * sVar58;
                    auVar68._4_4_ = uVar35;
                    auVar68._0_4_ = uVar35;
                    auVar68._8_4_ = uVar35;
                    auVar68._12_4_ = uVar35;
                    auVar44 = psubsw(auVar60,auVar68);
                    sVar51 = auVar44._0_2_;
                    auVar60._0_2_ =
                         (ushort)(sVar51 < sVar43) * sVar43 | (ushort)(sVar51 >= sVar43) * sVar51;
                    sVar43 = auVar44._2_2_;
                    auVar60._2_2_ =
                         (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
                    sVar43 = auVar44._4_2_;
                    auVar60._4_2_ =
                         (ushort)(sVar43 < sVar6) * sVar6 | (ushort)(sVar43 >= sVar6) * sVar43;
                    sVar43 = auVar44._6_2_;
                    auVar60._6_2_ =
                         (ushort)(sVar43 < sVar7) * sVar7 | (ushort)(sVar43 >= sVar7) * sVar43;
                    sVar43 = auVar44._8_2_;
                    auVar60._8_2_ =
                         (ushort)(sVar43 < sVar8) * sVar8 | (ushort)(sVar43 >= sVar8) * sVar43;
                    sVar43 = auVar44._10_2_;
                    auVar60._10_2_ =
                         (ushort)(sVar43 < sVar9) * sVar9 | (ushort)(sVar43 >= sVar9) * sVar43;
                    sVar43 = auVar44._12_2_;
                    sVar42 = auVar44._14_2_;
                    auVar60._12_2_ =
                         (ushort)(sVar43 < sVar10) * sVar10 | (ushort)(sVar43 >= sVar10) * sVar43;
                    auVar60._14_2_ =
                         (ushort)(sVar42 < sVar11) * sVar11 | (ushort)(sVar42 >= sVar11) * sVar42;
                    auVar63 = *(undefined1 (*) [16])((long)*ptr_02 + lVar31);
                    auVar44 = auVar45;
                  }
                  for (iVar28 = 0; iVar28 != 8; iVar28 = iVar28 + 1) {
                    uVar20 = uVar25;
                    if (s2_beg == 0) {
                      uVar20 = ptr_01[uVar27 + 1] - open;
                    }
                    if ((int)uVar20 < -0x7fff) {
                      uVar20 = 0xffff8000;
                    }
                    uVar59 = auVar60._0_8_;
                    auVar60._8_8_ = auVar60._8_8_ << 0x10 | uVar59 >> 0x30;
                    auVar60._0_8_ = uVar59 << 0x10 | (ulong)uVar20 & 0xffff;
                    lVar31 = 0;
                    auVar63 = auVar44;
                    auVar61 = auVar40;
                    while (uVar29 * 0x10 + 0x10 != lVar31 + 0x10) {
                      psVar2 = (short *)((long)*ptr + lVar31);
                      sVar42 = *psVar2;
                      sVar6 = psVar2[1];
                      sVar7 = psVar2[2];
                      sVar8 = psVar2[3];
                      sVar9 = psVar2[4];
                      sVar10 = psVar2[5];
                      sVar11 = psVar2[6];
                      sVar51 = psVar2[7];
                      sVar43 = auVar60._0_2_;
                      auVar62._0_2_ =
                           (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                      sVar43 = auVar60._2_2_;
                      auVar62._2_2_ =
                           (ushort)(sVar6 < sVar43) * sVar43 | (ushort)(sVar6 >= sVar43) * sVar6;
                      sVar43 = auVar60._4_2_;
                      auVar62._4_2_ =
                           (ushort)(sVar7 < sVar43) * sVar43 | (ushort)(sVar7 >= sVar43) * sVar7;
                      sVar43 = auVar60._6_2_;
                      auVar62._6_2_ =
                           (ushort)(sVar8 < sVar43) * sVar43 | (ushort)(sVar8 >= sVar43) * sVar8;
                      sVar43 = auVar60._8_2_;
                      auVar62._8_2_ =
                           (ushort)(sVar9 < sVar43) * sVar43 | (ushort)(sVar9 >= sVar43) * sVar9;
                      sVar43 = auVar60._10_2_;
                      auVar62._10_2_ =
                           (ushort)(sVar10 < sVar43) * sVar43 | (ushort)(sVar10 >= sVar43) * sVar10;
                      sVar43 = auVar60._12_2_;
                      auVar62._12_2_ =
                           (ushort)(sVar11 < sVar43) * sVar43 | (ushort)(sVar11 >= sVar43) * sVar11;
                      sVar43 = auVar60._14_2_;
                      auVar62._14_2_ =
                           (ushort)(sVar51 < sVar43) * sVar43 | (ushort)(sVar51 >= sVar43) * sVar51;
                      *(undefined1 (*) [16])((long)*ptr + lVar31) = auVar62;
                      sVar43 = auVar61._0_2_;
                      auVar40._0_2_ =
                           ((short)auVar62._0_2_ < sVar43) * auVar62._0_2_ |
                           (ushort)((short)auVar62._0_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._2_2_;
                      auVar40._2_2_ =
                           ((short)auVar62._2_2_ < sVar43) * auVar62._2_2_ |
                           (ushort)((short)auVar62._2_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._4_2_;
                      auVar40._4_2_ =
                           ((short)auVar62._4_2_ < sVar43) * auVar62._4_2_ |
                           (ushort)((short)auVar62._4_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._6_2_;
                      auVar40._6_2_ =
                           ((short)auVar62._6_2_ < sVar43) * auVar62._6_2_ |
                           (ushort)((short)auVar62._6_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._8_2_;
                      auVar40._8_2_ =
                           ((short)auVar62._8_2_ < sVar43) * auVar62._8_2_ |
                           (ushort)((short)auVar62._8_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._10_2_;
                      auVar40._10_2_ =
                           ((short)auVar62._10_2_ < sVar43) * auVar62._10_2_ |
                           (ushort)((short)auVar62._10_2_ >= sVar43) * sVar43;
                      sVar43 = auVar61._12_2_;
                      sVar42 = auVar61._14_2_;
                      auVar40._12_2_ =
                           ((short)auVar62._12_2_ < sVar43) * auVar62._12_2_ |
                           (ushort)((short)auVar62._12_2_ >= sVar43) * sVar43;
                      auVar40._14_2_ =
                           ((short)auVar62._14_2_ < sVar42) * auVar62._14_2_ |
                           (ushort)((short)auVar62._14_2_ >= sVar42) * sVar42;
                      sVar43 = auVar63._0_2_;
                      auVar44._0_2_ =
                           (sVar43 < (short)auVar62._0_2_) * auVar62._0_2_ |
                           (ushort)(sVar43 >= (short)auVar62._0_2_) * sVar43;
                      sVar43 = auVar63._2_2_;
                      auVar44._2_2_ =
                           (sVar43 < (short)auVar62._2_2_) * auVar62._2_2_ |
                           (ushort)(sVar43 >= (short)auVar62._2_2_) * sVar43;
                      sVar43 = auVar63._4_2_;
                      auVar44._4_2_ =
                           (sVar43 < (short)auVar62._4_2_) * auVar62._4_2_ |
                           (ushort)(sVar43 >= (short)auVar62._4_2_) * sVar43;
                      sVar43 = auVar63._6_2_;
                      auVar44._6_2_ =
                           (sVar43 < (short)auVar62._6_2_) * auVar62._6_2_ |
                           (ushort)(sVar43 >= (short)auVar62._6_2_) * sVar43;
                      sVar43 = auVar63._8_2_;
                      auVar44._8_2_ =
                           (sVar43 < (short)auVar62._8_2_) * auVar62._8_2_ |
                           (ushort)(sVar43 >= (short)auVar62._8_2_) * sVar43;
                      sVar43 = auVar63._10_2_;
                      auVar44._10_2_ =
                           (sVar43 < (short)auVar62._10_2_) * auVar62._10_2_ |
                           (ushort)(sVar43 >= (short)auVar62._10_2_) * sVar43;
                      sVar43 = auVar63._12_2_;
                      sVar42 = auVar63._14_2_;
                      auVar44._12_2_ =
                           (sVar43 < (short)auVar62._12_2_) * auVar62._12_2_ |
                           (ushort)(sVar43 >= (short)auVar62._12_2_) * sVar43;
                      auVar44._14_2_ =
                           (sVar42 < (short)auVar62._14_2_) * auVar62._14_2_ |
                           (ushort)(sVar42 >= (short)auVar62._14_2_) * sVar42;
                      auVar63 = psubsw(auVar62,auVar49);
                      auVar12._4_4_ = uVar35;
                      auVar12._0_4_ = uVar35;
                      auVar12._8_4_ = uVar35;
                      auVar12._12_4_ = uVar35;
                      auVar60 = psubsw(auVar60,auVar12);
                      auVar65._0_2_ = -(ushort)(auVar63._0_2_ < auVar60._0_2_);
                      auVar65._2_2_ = -(ushort)(auVar63._2_2_ < auVar60._2_2_);
                      auVar65._4_2_ = -(ushort)(auVar63._4_2_ < auVar60._4_2_);
                      auVar65._6_2_ = -(ushort)(auVar63._6_2_ < auVar60._6_2_);
                      auVar65._8_2_ = -(ushort)(auVar63._8_2_ < auVar60._8_2_);
                      auVar65._10_2_ = -(ushort)(auVar63._10_2_ < auVar60._10_2_);
                      auVar65._12_2_ = -(ushort)(auVar63._12_2_ < auVar60._12_2_);
                      auVar65._14_2_ = -(ushort)(auVar63._14_2_ < auVar60._14_2_);
                      lVar31 = lVar31 + 0x10;
                      auVar63 = auVar44;
                      auVar61 = auVar40;
                      if ((((((((((((((((auVar65 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar65 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar65 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar65 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar65 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar65 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar65 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar65 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar65 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar65 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar65 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar65 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar65 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar65._14_2_ >> 7 & 1) == 0) && (auVar65._14_2_ & 0x8000) == 0)
                      goto LAB_00518de4;
                    }
                    auVar44 = auVar63;
                    auVar40 = auVar61;
                  }
LAB_00518de4:
                  palVar15 = ptr + uVar48;
                  sVar43 = (short)(*palVar15)[0];
                  sVar42 = *(short *)((long)*palVar15 + 2);
                  sVar6 = *(short *)((long)*palVar15 + 4);
                  sVar7 = *(short *)((long)*palVar15 + 6);
                  sVar8 = (short)(*palVar15)[1];
                  sVar9 = *(short *)((long)*palVar15 + 10);
                  sVar10 = *(short *)((long)*palVar15 + 0xc);
                  sVar11 = *(short *)((long)*palVar15 + 0xe);
                  sVar51 = auVar52._0_2_;
                  auVar64._0_2_ = -(ushort)(sVar51 < sVar43);
                  sVar47 = auVar52._2_2_;
                  auVar64._2_2_ = -(ushort)(sVar47 < sVar42);
                  sVar53 = auVar52._4_2_;
                  auVar64._4_2_ = -(ushort)(sVar53 < sVar6);
                  sVar54 = auVar52._6_2_;
                  auVar64._6_2_ = -(ushort)(sVar54 < sVar7);
                  sVar55 = auVar52._8_2_;
                  auVar64._8_2_ = -(ushort)(sVar55 < sVar8);
                  sVar56 = auVar52._10_2_;
                  auVar64._10_2_ = -(ushort)(sVar56 < sVar9);
                  sVar57 = auVar52._12_2_;
                  auVar64._12_2_ = -(ushort)(sVar57 < sVar10);
                  sVar58 = auVar52._14_2_;
                  auVar64._14_2_ = -(ushort)(sVar58 < sVar11);
                  auVar13._2_2_ = -(ushort)(sVar39 == 6);
                  auVar13._0_2_ = -(ushort)(sVar34 == 7);
                  auVar13._4_2_ = -(ushort)(sVar34 == 5);
                  auVar13._6_2_ = -(ushort)(sVar39 == 4);
                  auVar13._8_2_ = -(ushort)(sVar34 == 3);
                  auVar13._10_2_ = -(ushort)(sVar39 == 2);
                  auVar13._12_2_ = -(ushort)(sVar34 == 1);
                  auVar13._14_2_ = -(ushort)(sVar39 == 0);
                  auVar64 = auVar64 & auVar13;
                  if ((((((((((((((((auVar64 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar64 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar64 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar64 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar64 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar64 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar64 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar64 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar64 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar64 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar64 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar64 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar64[0xf] < '\0') {
                    iVar18 = (int)uVar27;
                  }
                  auVar52._0_2_ =
                       (ushort)(sVar51 < sVar43) * sVar43 | (ushort)(sVar51 >= sVar43) * sVar51;
                  auVar52._2_2_ =
                       (ushort)(sVar47 < sVar42) * sVar42 | (ushort)(sVar47 >= sVar42) * sVar47;
                  auVar52._4_2_ =
                       (ushort)(sVar53 < sVar6) * sVar6 | (ushort)(sVar53 >= sVar6) * sVar53;
                  auVar52._6_2_ =
                       (ushort)(sVar54 < sVar7) * sVar7 | (ushort)(sVar54 >= sVar7) * sVar54;
                  auVar52._8_2_ =
                       (ushort)(sVar55 < sVar8) * sVar8 | (ushort)(sVar55 >= sVar8) * sVar55;
                  auVar52._10_2_ =
                       (ushort)(sVar56 < sVar9) * sVar9 | (ushort)(sVar56 >= sVar9) * sVar56;
                  auVar52._12_2_ =
                       (ushort)(sVar57 < sVar10) * sVar10 | (ushort)(sVar57 >= sVar10) * sVar57;
                  auVar52._14_2_ =
                       (ushort)(sVar58 < sVar11) * sVar11 | (ushort)(sVar58 >= sVar11) * sVar58;
                  uVar27 = uVar27 + 1;
                  palVar15 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_striped_profile_sse2_128_16",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}